

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall
IRBuilder::BuildElementSlotI1
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot regSlot,int32 slotId,
          ProfileId profileId)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  DWORD DVar5;
  RegSlot RVar6;
  JITTimeFunctionBody *pJVar7;
  Func *this_00;
  IntConstOpnd *src1Opnd;
  Opnd *src2Opnd;
  RegOpnd *dstOpnd;
  RegOpnd *src2Opnd_00;
  undefined4 *puVar8;
  OpCode OVar9;
  uint local_94;
  RegOpnd *dataOpnd;
  Opnd *environmentOpnd;
  Opnd *functionBodySlotOpnd;
  StackSym *pSStack_68;
  uint scopeSlotSize;
  StackSym *closureSym;
  bool reuseLoc;
  bool isLdSlotThatWasNotProfiled;
  StackSym *pSStack_58;
  SymID symID;
  StackSym *stackFuncPtrSym;
  PropertySym *fieldSym;
  ByteCodeUsesInstr *byteCodeUse;
  Instr *instr;
  SymOpnd *fieldOpnd;
  RegOpnd *regOpnd;
  uint local_20;
  RegSlot RStack_1c;
  ProfileId profileId_local;
  int32 slotId_local;
  RegSlot regSlot_local;
  uint32 offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  byteCodeUse = (ByteCodeUsesInstr *)0x0;
  stackFuncPtrSym = (StackSym *)0x0;
  pSStack_58 = (StackSym *)0x0;
  regOpnd._6_2_ = profileId;
  local_20 = slotId;
  RStack_1c = regSlot;
  slotId_local = offset;
  regSlot_local._2_2_ = newOpcode;
  _offset_local = this;
  pJVar7 = Func::GetJITFunctionBody(this->m_func);
  closureSym._4_4_ = JITTimeFunctionBody::GetLocalClosureReg(pJVar7);
  closureSym._3_1_ = 0;
  closureSym._2_1_ = 0;
  pSStack_68 = Func::GetLocalClosureSym(this->m_func);
  bVar2 = IsParamScopeDone(this);
  if (bVar2) {
    pJVar7 = Func::GetJITFunctionBody(this->m_func);
    local_94 = JITTimeFunctionBody::GetScopeSlotArraySize(pJVar7);
  }
  else {
    pJVar7 = Func::GetJITFunctionBody(this->m_func);
    local_94 = JITTimeFunctionBody::GetParamScopeSlotArraySize(pJVar7);
  }
  functionBodySlotOpnd._4_4_ = local_94;
  if (regSlot_local._2_2_ == LdLocalSlot) {
LAB_00648c90:
    uVar3 = Func::GetSourceContextId(this->m_func);
    uVar4 = Func::GetLocalFunctionId(this->m_func);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,ClosureRangeCheckPhase,uVar3,uVar4);
    if ((!bVar2) && (functionBodySlotOpnd._4_4_ + 2 <= local_20)) {
      Js::Throw::FatalInternalError(-0x7fffbffb);
    }
    bVar2 = StackSym::HasByteCodeRegSlot(pSStack_68);
    if (bVar2) {
      fieldSym = (PropertySym *)IR::ByteCodeUsesInstr::New(this->m_func,slotId_local);
      IR::ByteCodeUsesInstr::SetNonOpndSymbol
                ((ByteCodeUsesInstr *)fieldSym,(pSStack_68->super_Sym).m_id);
      AddInstr(this,(Instr *)fieldSym,slotId_local);
    }
    regSlot_local._2_2_ = LdSlot;
    bVar2 = Func::DoStackFrameDisplay(this->m_func);
    if (bVar2) {
      instr = (Instr *)BuildFieldOpnd(this,LdSlotArr,(pSStack_68->super_Sym).m_id,0,0xffffffff,
                                      PropertyKindSlotArray,0xffffffff);
      fieldOpnd = (SymOpnd *)IR::RegOpnd::New(TyVar,this->m_func);
      byteCodeUse = (ByteCodeUsesInstr *)
                    IR::Instr::New(LdSlotArr,(Opnd *)fieldOpnd,(Opnd *)instr,this->m_func);
      AddInstr(this,(Instr *)byteCodeUse,slotId_local);
      closureSym._4_4_ = fieldOpnd->m_sym->m_id;
      bVar2 = IsLoopBody(this);
      if (bVar2) {
        instr = (Instr *)BuildFieldOpnd(this,LdSlotArr,(pSStack_68->super_Sym).m_id,local_20,
                                        0xffffffff,PropertyKindSlotArray,0xffffffff);
      }
    }
    else {
      bVar2 = IsLoopBody(this);
      if (bVar2) {
        EnsureLoopBodyLoadSlot(this,closureSym._4_4_,false);
      }
    }
    stackFuncPtrSym =
         (StackSym *)
         PropertySym::FindOrCreate
                   (closureSym._4_4_,local_20,0xffffffff,0xffffffff,PropertyKindSlots,this->m_func);
    instr = (Instr *)IR::SymOpnd::New((Sym *)stackFuncPtrSym,TyVar,this->m_func);
    fieldOpnd = (SymOpnd *)BuildDstOpnd(this,RStack_1c,TyVar,false,false);
    byteCodeUse = (ByteCodeUsesInstr *)0x0;
    if (regOpnd._6_2_ != 0xffff) {
      byteCodeUse = (ByteCodeUsesInstr *)
                    BuildProfiledSlotLoad
                              (this,LdSlot,(RegOpnd *)fieldOpnd,(SymOpnd *)instr,regOpnd._6_2_,
                               (bool *)((long)&closureSym + 3));
    }
    if (byteCodeUse == (ByteCodeUsesInstr *)0x0) {
      byteCodeUse = (ByteCodeUsesInstr *)
                    IR::Instr::New(LdSlot,&fieldOpnd->super_Opnd,(Opnd *)instr,this->m_func);
    }
    AddInstr(this,&byteCodeUse->super_Instr,slotId_local);
    goto LAB_00649905;
  }
  if (regSlot_local._2_2_ == StLocalSlot) {
LAB_006491b5:
    uVar3 = Func::GetSourceContextId(this->m_func);
    uVar4 = Func::GetLocalFunctionId(this->m_func);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,ClosureRangeCheckPhase,uVar3,uVar4);
    if ((!bVar2) && (functionBodySlotOpnd._4_4_ + 2 <= local_20)) {
      Js::Throw::FatalInternalError(-0x7fffbffb);
    }
    bVar2 = StackSym::HasByteCodeRegSlot(pSStack_68);
    if (bVar2) {
      fieldSym = (PropertySym *)IR::ByteCodeUsesInstr::New(this->m_func,slotId_local);
      IR::ByteCodeUsesInstr::SetNonOpndSymbol
                ((ByteCodeUsesInstr *)fieldSym,(pSStack_68->super_Sym).m_id);
      AddInstr(this,(Instr *)fieldSym,slotId_local);
    }
    bVar2 = regSlot_local._2_2_ == StLocalSlot;
    regSlot_local._2_2_ = StSlotChkUndecl;
    if (bVar2) {
      regSlot_local._2_2_ = StSlot;
    }
    bVar2 = Func::DoStackFrameDisplay(this->m_func);
    if (bVar2) {
      fieldOpnd = (SymOpnd *)IR::RegOpnd::New(TyVar,this->m_func);
      instr = (Instr *)BuildFieldOpnd(this,LdSlotArr,(pSStack_68->super_Sym).m_id,0,0xffffffff,
                                      PropertyKindSlotArray,0xffffffff);
      byteCodeUse = (ByteCodeUsesInstr *)
                    IR::Instr::New(LdSlotArr,&fieldOpnd->super_Opnd,(Opnd *)instr,this->m_func);
      AddInstr(this,(Instr *)byteCodeUse,slotId_local);
      closureSym._4_4_ = fieldOpnd->m_sym->m_id;
      bVar2 = IsLoopBody(this);
      if (bVar2) {
        instr = (Instr *)BuildFieldOpnd(this,LdSlotArr,(pSStack_68->super_Sym).m_id,local_20,
                                        0xffffffff,PropertyKindSlotArray,0xffffffff);
      }
    }
    else {
      bVar2 = IsLoopBody(this);
      if (bVar2) {
        EnsureLoopBodyLoadSlot(this,closureSym._4_4_,false);
      }
    }
    stackFuncPtrSym =
         (StackSym *)
         PropertySym::FindOrCreate
                   (closureSym._4_4_,local_20,0xffffffff,0xffffffff,PropertyKindSlots,this->m_func);
    instr = (Instr *)IR::SymOpnd::New((Sym *)stackFuncPtrSym,TyVar,this->m_func);
    fieldOpnd = (SymOpnd *)BuildSrcOpnd(this,RStack_1c,TyVar);
    byteCodeUse = (ByteCodeUsesInstr *)
                  IR::Instr::New(regSlot_local._2_2_,(Opnd *)instr,(Opnd *)fieldOpnd,this->m_func);
    AddInstr(this,(Instr *)byteCodeUse,slotId_local);
    if (regSlot_local._2_2_ == StSlotChkUndecl) {
      IR::Instr::SetSrc2(&byteCodeUse->super_Instr,(Opnd *)instr);
    }
  }
  else {
    if (regSlot_local._2_2_ == NewScFunc) {
LAB_0064970e:
      src1Opnd = IR::IntConstOpnd::New((long)(int)local_20,TyInt32,this->m_func,true);
      src2Opnd = GetEnvironmentOperand(this,slotId_local);
      fieldOpnd = (SymOpnd *)BuildDstOpnd(this,RStack_1c,TyVar,false,false);
      if (pSStack_58 == (StackSym *)0x0) {
        byteCodeUse = (ByteCodeUsesInstr *)
                      IR::Instr::New(regSlot_local._2_2_,(Opnd *)fieldOpnd,&src1Opnd->super_Opnd,
                                     src2Opnd,this->m_func);
      }
      else {
        dstOpnd = IR::RegOpnd::New(TyVar,this->m_func);
        src2Opnd_00 = IR::RegOpnd::New(pSStack_58,TyVar,this->m_func);
        byteCodeUse = (ByteCodeUsesInstr *)
                      IR::Instr::New(NewScFuncData,&dstOpnd->super_Opnd,src2Opnd,
                                     &src2Opnd_00->super_Opnd,this->m_func);
        AddInstr(this,(Instr *)byteCodeUse,slotId_local);
        byteCodeUse = (ByteCodeUsesInstr *)
                      IR::Instr::New(regSlot_local._2_2_,&fieldOpnd->super_Opnd,
                                     &src1Opnd->super_Opnd,&dstOpnd->super_Opnd,this->m_func);
      }
      if (((ulong)fieldOpnd->m_sym[1]._vptr_Sym & 1) != 0) {
        *(uint *)&fieldOpnd->m_sym[1]._vptr_Sym =
             *(uint *)&fieldOpnd->m_sym[1]._vptr_Sym & 0xfffffffb | 4;
        *(uint *)&fieldOpnd->m_sym[1]._vptr_Sym =
             *(uint *)&fieldOpnd->m_sym[1]._vptr_Sym & 0xfffffffd | 2;
      }
      AddInstr(this,&byteCodeUse->super_Instr,slotId_local);
      return;
    }
    if (regSlot_local._2_2_ == NewScGenFunc) {
      regSlot_local._2_2_ = NewScGenFunc;
      goto LAB_0064970e;
    }
    if (regSlot_local._2_2_ == NewStackScFunc) {
      pSStack_58 = EnsureStackFuncPtrSym(this);
      regSlot_local._2_2_ = NewScFunc;
      goto LAB_0064970e;
    }
    if (regSlot_local._2_2_ != LdEnvObj) {
      if (regSlot_local._2_2_ != LdEnvObj_ReuseLoc) {
        if (regSlot_local._2_2_ == LdParamSlot) {
          pJVar7 = Func::GetJITFunctionBody(this->m_func);
          functionBodySlotOpnd._4_4_ = JITTimeFunctionBody::GetParamScopeSlotArraySize(pJVar7);
          pSStack_68 = Func::GetParamClosureSym(this->m_func);
          pJVar7 = Func::GetJITFunctionBody(this->m_func);
          closureSym._4_4_ = JITTimeFunctionBody::GetParamClosureReg(pJVar7);
          goto LAB_00648c90;
        }
        if (regSlot_local._2_2_ != LdLocalObjSlot) {
          if (regSlot_local._2_2_ != LdParamObjSlot) {
            if (regSlot_local._2_2_ != StParamSlot) {
              if (regSlot_local._2_2_ == StLocalSlotChkUndecl) goto LAB_006491b5;
              if (regSlot_local._2_2_ != StParamSlotChkUndecl) {
                if (regSlot_local._2_2_ != StLocalObjSlot) {
                  if (regSlot_local._2_2_ != StParamObjSlot) {
                    if (regSlot_local._2_2_ == StLocalObjSlotChkUndecl) goto LAB_00649489;
                    if (regSlot_local._2_2_ != StParamObjSlotChkUndecl) {
                      AssertCount = AssertCount + 1;
                      Js::Throw::LogAssert();
                      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                      *puVar8 = 1;
                      bVar2 = Js::Throw::ReportAssert
                                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                                         ,0xf47,"(0)","0");
                      if (!bVar2) {
                        pcVar1 = (code *)invalidInstructionException();
                        (*pcVar1)();
                      }
                      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                      *puVar8 = 0;
                      goto LAB_00649905;
                    }
                  }
                  pSStack_68 = Func::GetParamClosureSym(this->m_func);
                  pJVar7 = Func::GetJITFunctionBody(this->m_func);
                  closureSym._4_4_ = JITTimeFunctionBody::GetParamClosureReg(pJVar7);
                  bVar2 = regSlot_local._2_2_ == StParamObjSlot;
                  regSlot_local._2_2_ = StLocalObjSlotChkUndecl;
                  if (bVar2) {
                    regSlot_local._2_2_ = StLocalObjSlot;
                  }
                }
LAB_00649489:
                bVar2 = StackSym::HasByteCodeRegSlot(pSStack_68);
                if (bVar2) {
                  fieldSym = (PropertySym *)IR::ByteCodeUsesInstr::New(this->m_func,slotId_local);
                  IR::ByteCodeUsesInstr::SetNonOpndSymbol
                            ((ByteCodeUsesInstr *)fieldSym,(pSStack_68->super_Sym).m_id);
                  AddInstr(this,(Instr *)fieldSym,slotId_local);
                }
                fieldOpnd = (SymOpnd *)IR::RegOpnd::New(TyVar,this->m_func);
                RVar6 = closureSym._4_4_;
                DVar5 = Js::DynamicObject::GetOffsetOfAuxSlots();
                instr = (Instr *)BuildFieldOpnd(this,LdSlotArr,RVar6,DVar5 >> 3,0xffffffff,
                                                PropertyKindSlotArray,0xffffffff);
                byteCodeUse = (ByteCodeUsesInstr *)
                              IR::Instr::New(LdSlotArr,&fieldOpnd->super_Opnd,(Opnd *)instr,
                                             this->m_func);
                AddInstr(this,(Instr *)byteCodeUse,slotId_local);
                OVar9 = StSlotChkUndecl;
                if (regSlot_local._2_2_ == StLocalObjSlot) {
                  OVar9 = StSlot;
                }
                regSlot_local._2_2_ = OVar9;
                stackFuncPtrSym =
                     (StackSym *)
                     PropertySym::New((StackSym *)fieldOpnd->m_sym,local_20,0xffffffff,0xffffffff,
                                      PropertyKindSlots,this->m_func);
                instr = (Instr *)IR::SymOpnd::New((Sym *)stackFuncPtrSym,TyVar,this->m_func);
                fieldOpnd = (SymOpnd *)BuildSrcOpnd(this,RStack_1c,TyVar);
                byteCodeUse = (ByteCodeUsesInstr *)
                              IR::Instr::New(regSlot_local._2_2_,(Opnd *)instr,(Opnd *)fieldOpnd,
                                             this->m_func);
                if (regSlot_local._2_2_ == StSlotChkUndecl) {
                  IR::Instr::SetSrc2((Instr *)byteCodeUse,(Opnd *)instr);
                }
                AddInstr(this,&byteCodeUse->super_Instr,slotId_local);
                goto LAB_00649905;
              }
            }
            pJVar7 = Func::GetJITFunctionBody(this->m_func);
            functionBodySlotOpnd._4_4_ = JITTimeFunctionBody::GetParamScopeSlotArraySize(pJVar7);
            pSStack_68 = Func::GetParamClosureSym(this->m_func);
            pJVar7 = Func::GetJITFunctionBody(this->m_func);
            closureSym._4_4_ = JITTimeFunctionBody::GetParamClosureReg(pJVar7);
            bVar2 = regSlot_local._2_2_ == StParamSlot;
            regSlot_local._2_2_ = StLocalSlotChkUndecl;
            if (bVar2) {
              regSlot_local._2_2_ = StLocalSlot;
            }
            goto LAB_006491b5;
          }
          pSStack_68 = Func::GetParamClosureSym(this->m_func);
          pJVar7 = Func::GetJITFunctionBody(this->m_func);
          closureSym._4_4_ = JITTimeFunctionBody::GetParamClosureReg(pJVar7);
          regSlot_local._2_2_ = LdLocalObjSlot;
        }
        bVar2 = StackSym::HasByteCodeRegSlot(pSStack_68);
        if (bVar2) {
          fieldSym = (PropertySym *)IR::ByteCodeUsesInstr::New(this->m_func,slotId_local);
          IR::ByteCodeUsesInstr::SetNonOpndSymbol
                    ((ByteCodeUsesInstr *)fieldSym,(pSStack_68->super_Sym).m_id);
          AddInstr(this,(Instr *)fieldSym,slotId_local);
        }
        OVar9 = regSlot_local._2_2_;
        RVar6 = closureSym._4_4_;
        DVar5 = Js::DynamicObject::GetOffsetOfAuxSlots();
        instr = (Instr *)BuildFieldOpnd(this,OVar9,RVar6,DVar5 >> 3,0xffffffff,PropertyKindSlotArray
                                        ,0xffffffff);
        fieldOpnd = (SymOpnd *)IR::RegOpnd::New(TyVar,this->m_func);
        byteCodeUse = (ByteCodeUsesInstr *)
                      IR::Instr::New(LdSlotArr,(Opnd *)fieldOpnd,(Opnd *)instr,this->m_func);
        AddInstr(this,(Instr *)byteCodeUse,slotId_local);
        stackFuncPtrSym =
             (StackSym *)
             PropertySym::New((StackSym *)fieldOpnd->m_sym,local_20,0xffffffff,0xffffffff,
                              PropertyKindSlots,this->m_func);
        instr = (Instr *)IR::SymOpnd::New((Sym *)stackFuncPtrSym,TyVar,this->m_func);
        fieldOpnd = (SymOpnd *)BuildDstOpnd(this,RStack_1c,TyVar,false,false);
        byteCodeUse = (ByteCodeUsesInstr *)0x0;
        regSlot_local._2_2_ = LdSlot;
        if (regOpnd._6_2_ != 0xffff) {
          byteCodeUse = (ByteCodeUsesInstr *)
                        BuildProfiledSlotLoad
                                  (this,LdSlot,(RegOpnd *)fieldOpnd,(SymOpnd *)instr,regOpnd._6_2_,
                                   (bool *)((long)&closureSym + 3));
        }
        if (byteCodeUse == (ByteCodeUsesInstr *)0x0) {
          byteCodeUse = (ByteCodeUsesInstr *)
                        IR::Instr::New(regSlot_local._2_2_,&fieldOpnd->super_Opnd,(Opnd *)instr,
                                       this->m_func);
        }
        AddInstr(this,&byteCodeUse->super_Instr,slotId_local);
        goto LAB_00649905;
      }
      closureSym._2_1_ = 1;
    }
    RVar6 = GetEnvReg(this);
    instr = (Instr *)BuildFieldOpnd(this,LdSlotArr,RVar6,local_20,0xffffffff,PropertyKindSlotArray,
                                    0xffffffff);
    fieldOpnd = (SymOpnd *)BuildDstOpnd(this,RStack_1c,TyVar,false,(bool)(closureSym._2_1_ & 1));
    byteCodeUse = (ByteCodeUsesInstr *)
                  IR::Instr::New(LdSlotArr,(Opnd *)fieldOpnd,(Opnd *)instr,this->m_func);
    AddInstr(this,(Instr *)byteCodeUse,slotId_local);
    this_00 = Func::GetTopFunc(this->m_func);
    Func::AddFrameDisplayCheck(this_00,(SymOpnd *)instr,0xffffffff);
  }
LAB_00649905:
  if (((closureSym._3_1_ & 1) != 0) && (bVar2 = DoBailOnNoProfile(this), bVar2)) {
    InsertBailOnNoProfile(this,&byteCodeUse->super_Instr);
  }
  return;
}

Assistant:

void
IRBuilder::BuildElementSlotI1(Js::OpCode newOpcode, uint32 offset, Js::RegSlot regSlot,
                              int32 slotId, Js::ProfileId profileId)
{
    IR::RegOpnd *regOpnd;
    IR::SymOpnd *fieldOpnd;
    IR::Instr   *instr = nullptr;
    IR::ByteCodeUsesInstr *byteCodeUse;
    PropertySym *fieldSym = nullptr;
    StackSym *   stackFuncPtrSym = nullptr;
    SymID        symID = m_func->GetJITFunctionBody()->GetLocalClosureReg();
    bool isLdSlotThatWasNotProfiled = false;
    bool reuseLoc = false;
    StackSym* closureSym = m_func->GetLocalClosureSym();

    uint scopeSlotSize = this->IsParamScopeDone() ? m_func->GetJITFunctionBody()->GetScopeSlotArraySize() : m_func->GetJITFunctionBody()->GetParamScopeSlotArraySize();

    switch (newOpcode)
    {
        case Js::OpCode::LdParamSlot:
            scopeSlotSize = m_func->GetJITFunctionBody()->GetParamScopeSlotArraySize();
            closureSym = m_func->GetParamClosureSym();
            symID = m_func->GetJITFunctionBody()->GetParamClosureReg();
            // Fall through

        case Js::OpCode::LdLocalSlot:
            if (!PHASE_OFF(Js::ClosureRangeCheckPhase, m_func))
            {
                if ((uint32)slotId >= scopeSlotSize + Js::ScopeSlots::FirstSlotIndex)
                {
                    Js::Throw::FatalInternalError();
                }
            }

            if (closureSym->HasByteCodeRegSlot())
            {
                byteCodeUse = IR::ByteCodeUsesInstr::New(m_func, offset);
                byteCodeUse->SetNonOpndSymbol(closureSym->m_id);
                this->AddInstr(byteCodeUse, offset);
            }

            // Read the scope slot pointer back using the stack closure sym.
            newOpcode = Js::OpCode::LdSlot;
            if (m_func->DoStackFrameDisplay())
            {
                // Read the scope slot pointer back using the stack closure sym.
                fieldOpnd = this->BuildFieldOpnd(Js::OpCode::LdSlotArr, closureSym->m_id, 0, (Js::PropertyIdIndexType)-1, PropertyKindSlotArray);

                regOpnd = IR::RegOpnd::New(TyVar, m_func);
                instr = IR::Instr::New(Js::OpCode::LdSlotArr, regOpnd, fieldOpnd, m_func);
                this->AddInstr(instr, offset);
                symID = regOpnd->m_sym->m_id;

                if (IsLoopBody())
                {
                    fieldOpnd = this->BuildFieldOpnd(Js::OpCode::LdSlotArr, closureSym->m_id, slotId, (Js::PropertyIdIndexType)-1, PropertyKindSlotArray);
                }
            }
            else if (IsLoopBody())
            {
                this->EnsureLoopBodyLoadSlot(symID);
            }

            fieldSym = PropertySym::FindOrCreate(symID, slotId, (uint32)-1, (uint)-1, PropertyKindSlots, m_func);
            fieldOpnd = IR::SymOpnd::New(fieldSym, TyVar, m_func);
            regOpnd = this->BuildDstOpnd(regSlot);
            instr = nullptr;
            if (profileId != Js::Constants::NoProfileId)
            {
                instr = this->BuildProfiledSlotLoad(Js::OpCode::LdSlot, regOpnd, fieldOpnd, profileId, &isLdSlotThatWasNotProfiled);
            }
            if (!instr)
            {
                instr = IR::Instr::New(Js::OpCode::LdSlot, regOpnd, fieldOpnd, m_func);
            }
            this->AddInstr(instr, offset);

            break;

        case Js::OpCode::LdParamObjSlot:
            closureSym = m_func->GetParamClosureSym();
            symID = m_func->GetJITFunctionBody()->GetParamClosureReg();
            newOpcode = Js::OpCode::LdLocalObjSlot;
            // Fall through

        case Js::OpCode::LdLocalObjSlot:
            if (closureSym->HasByteCodeRegSlot())
            {
                byteCodeUse = IR::ByteCodeUsesInstr::New(m_func, offset);
                byteCodeUse->SetNonOpndSymbol(closureSym->m_id);
                this->AddInstr(byteCodeUse, offset);
            }

            fieldOpnd = this->BuildFieldOpnd(newOpcode, symID, (Js::DynamicObject::GetOffsetOfAuxSlots()) / sizeof(Js::Var), (Js::PropertyIdIndexType) - 1, PropertyKindSlotArray);
            regOpnd = IR::RegOpnd::New(TyVar, m_func);
            instr = IR::Instr::New(Js::OpCode::LdSlotArr, regOpnd, fieldOpnd, m_func);
            this->AddInstr(instr, offset);

            fieldSym = PropertySym::New(regOpnd->m_sym, slotId, (uint32)-1, (uint)-1, PropertyKindSlots, m_func);
            fieldOpnd = IR::SymOpnd::New(fieldSym, TyVar, m_func);

            regOpnd = this->BuildDstOpnd(regSlot);
            instr = nullptr;
            newOpcode = Js::OpCode::LdSlot;
            if (profileId != Js::Constants::NoProfileId)
            {
                instr = this->BuildProfiledSlotLoad(newOpcode, regOpnd, fieldOpnd, profileId, &isLdSlotThatWasNotProfiled);
            }
            if (!instr)
            {
                instr = IR::Instr::New(newOpcode, regOpnd, fieldOpnd, m_func);
            }
            this->AddInstr(instr, offset);
            break;

        case Js::OpCode::StParamSlot:
        case Js::OpCode::StParamSlotChkUndecl:
            scopeSlotSize = m_func->GetJITFunctionBody()->GetParamScopeSlotArraySize();
            closureSym = m_func->GetParamClosureSym();
            symID = m_func->GetJITFunctionBody()->GetParamClosureReg();
            newOpcode = newOpcode == Js::OpCode::StParamSlot ? Js::OpCode::StLocalSlot : Js::OpCode::StLocalSlotChkUndecl;
            // Fall through

        case Js::OpCode::StLocalSlot:
        case Js::OpCode::StLocalSlotChkUndecl:
            if (!PHASE_OFF(Js::ClosureRangeCheckPhase, m_func))
            {
                if ((uint32)slotId >= scopeSlotSize + Js::ScopeSlots::FirstSlotIndex)
                {
                    Js::Throw::FatalInternalError();
                }
            }

            if (closureSym->HasByteCodeRegSlot())
            {
                byteCodeUse = IR::ByteCodeUsesInstr::New(m_func, offset);
                byteCodeUse->SetNonOpndSymbol(closureSym->m_id);
                this->AddInstr(byteCodeUse, offset);
            }

            newOpcode = newOpcode == Js::OpCode::StLocalSlot ? Js::OpCode::StSlot : Js::OpCode::StSlotChkUndecl;
            if (m_func->DoStackFrameDisplay())
            {
                regOpnd = IR::RegOpnd::New(TyVar, m_func);
                // Read the scope slot pointer back using the stack closure sym.
                fieldOpnd = this->BuildFieldOpnd(Js::OpCode::LdSlotArr, closureSym->m_id, 0, (Js::PropertyIdIndexType)-1, PropertyKindSlotArray);

                instr = IR::Instr::New(Js::OpCode::LdSlotArr, regOpnd, fieldOpnd, m_func);
                this->AddInstr(instr, offset);
                symID = regOpnd->m_sym->m_id;

                if (IsLoopBody())
                {
                    fieldOpnd = this->BuildFieldOpnd(Js::OpCode::LdSlotArr, closureSym->m_id, slotId, (Js::PropertyIdIndexType)-1, PropertyKindSlotArray);
                }
            }
            else
            {
                if (IsLoopBody())
                {
                    this->EnsureLoopBodyLoadSlot(symID);
                }
            }
            fieldSym = PropertySym::FindOrCreate(symID, slotId, (uint32)-1, (uint)-1, PropertyKindSlots, m_func);
            fieldOpnd = IR::SymOpnd::New(fieldSym, TyVar, m_func);
            regOpnd = this->BuildSrcOpnd(regSlot);
            instr = IR::Instr::New(newOpcode, fieldOpnd, regOpnd, m_func);
            this->AddInstr(instr, offset);
            if (newOpcode == Js::OpCode::StSlotChkUndecl)
            {
                instr->SetSrc2(fieldOpnd);
            }

            break;

        case Js::OpCode::StParamObjSlot:
        case Js::OpCode::StParamObjSlotChkUndecl:
            closureSym = m_func->GetParamClosureSym();
            symID = m_func->GetJITFunctionBody()->GetParamClosureReg();
            newOpcode = newOpcode == Js::OpCode::StParamObjSlot ? Js::OpCode::StLocalObjSlot : Js::OpCode::StLocalObjSlotChkUndecl;
            // Fall through

        case Js::OpCode::StLocalObjSlot:
        case Js::OpCode::StLocalObjSlotChkUndecl:
            if (closureSym->HasByteCodeRegSlot())
            {
                byteCodeUse = IR::ByteCodeUsesInstr::New(m_func, offset);
                byteCodeUse->SetNonOpndSymbol(closureSym->m_id);
                this->AddInstr(byteCodeUse, offset);
            }

            regOpnd = IR::RegOpnd::New(TyVar, m_func);
            fieldOpnd = this->BuildFieldOpnd(Js::OpCode::LdSlotArr, symID, (Js::DynamicObject::GetOffsetOfAuxSlots())/sizeof(Js::Var), (Js::PropertyIdIndexType)-1, PropertyKindSlotArray);
            instr = IR::Instr::New(Js::OpCode::LdSlotArr, regOpnd, fieldOpnd, m_func);
            this->AddInstr(instr, offset);

            newOpcode = newOpcode == Js::OpCode::StLocalObjSlot ? Js::OpCode::StSlot : Js::OpCode::StSlotChkUndecl;
            fieldSym = PropertySym::New(regOpnd->m_sym, slotId, (uint32)-1, (uint)-1, PropertyKindSlots, m_func);
            fieldOpnd = IR::SymOpnd::New(fieldSym, TyVar, m_func);
            regOpnd = this->BuildSrcOpnd(regSlot);

            instr = IR::Instr::New(newOpcode, fieldOpnd, regOpnd, m_func);
            if (newOpcode == Js::OpCode::StSlotChkUndecl)
            {
                // ChkUndecl includes an implicit read of the destination. Communicate the liveness by using the destination in src2.
                instr->SetSrc2(fieldOpnd);
            }
            this->AddInstr(instr, offset);
            break;

        case Js::OpCode::LdEnvObj_ReuseLoc:
            reuseLoc = true;
            // fall through
        case Js::OpCode::LdEnvObj:
            fieldOpnd = this->BuildFieldOpnd(Js::OpCode::LdSlotArr, this->GetEnvReg(), slotId, (Js::PropertyIdIndexType)-1, PropertyKindSlotArray);
            regOpnd = this->BuildDstOpnd(regSlot, TyVar, false, reuseLoc);
            instr = IR::Instr::New(Js::OpCode::LdSlotArr, regOpnd, fieldOpnd, m_func);
            this->AddInstr(instr, offset);

            m_func->GetTopFunc()->AddFrameDisplayCheck(fieldOpnd);
            break;

        case Js::OpCode::NewStackScFunc:
            stackFuncPtrSym = this->EnsureStackFuncPtrSym();
            newOpcode = Js::OpCode::NewScFunc;
            // fall through
        case Js::OpCode::NewScFunc:
            goto NewScFuncCommon;

        case Js::OpCode::NewScGenFunc:
            newOpcode = Js::OpCode::NewScGenFunc;
NewScFuncCommon:
            {
                IR::Opnd * functionBodySlotOpnd = IR::IntConstOpnd::New(slotId, TyInt32, m_func, true);

                IR::Opnd *environmentOpnd = GetEnvironmentOperand(offset);
                regOpnd = this->BuildDstOpnd(regSlot);
                if (stackFuncPtrSym)
                {
                    IR::RegOpnd * dataOpnd = IR::RegOpnd::New(TyVar, m_func);
                    instr = IR::Instr::New(Js::OpCode::NewScFuncData, dataOpnd, environmentOpnd, 
                                           IR::RegOpnd::New(stackFuncPtrSym, TyVar, m_func), m_func);
                    this->AddInstr(instr, offset);
                    instr = IR::Instr::New(newOpcode, regOpnd, functionBodySlotOpnd, dataOpnd, m_func);
                }
                else
                {
                    instr = IR::Instr::New(newOpcode, regOpnd, functionBodySlotOpnd, environmentOpnd, m_func);
                }
                if (regOpnd->m_sym->m_isSingleDef)
                {
                    regOpnd->m_sym->m_isSafeThis = true;
                    regOpnd->m_sym->m_isNotNumber = true;
                }
                this->AddInstr(instr, offset);
                return;
            }

        default:
            Assert(0);
    }


    if(isLdSlotThatWasNotProfiled && DoBailOnNoProfile())
    {
        InsertBailOnNoProfile(instr);
    }
}